

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.hpp
# Opt level: O1

bool __thiscall
supermap::BloomFilter<supermap::Key<128UL>_>::mightContain
          (BloomFilter<supermap::Key<128UL>_> *this,Key<128UL> *value)

{
  pointer puVar1;
  Hasher *pHVar2;
  _Bit_type *p_Var3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar6;
  IllegalStateException *this_00;
  ulong uVar7;
  unsigned_long *seed;
  pointer puVar8;
  string data;
  string local_50;
  
  if (((this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
       ._M_start.super__Bit_iterator_base._M_p ==
       (this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
       ._M_finish.super__Bit_iterator_base._M_p) &&
     ((this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset == 0)) {
    this_00 = (IllegalStateException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Filter size was not reserved or was set to zero","");
    supermap::IllegalStateException::IllegalStateException(this_00,(string *)&local_50);
    __cxa_throw(this_00,&IllegalStateException::typeinfo,std::logic_error::~logic_error);
  }
  BloomFilter<supermap::Key<128ul>>::serialize_abi_cxx11_(&local_50,this,value);
  puVar1 = (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar8 = (this->seeds_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start; bVar4 = puVar8 == puVar1, !bVar4;
      puVar8 = puVar8 + 1) {
    pHVar2 = (this->hasher_)._M_t.
             super___uniq_ptr_impl<supermap::Hasher,_std::default_delete<supermap::Hasher>_>._M_t.
             super__Tuple_impl<0UL,_supermap::Hasher_*,_std::default_delete<supermap::Hasher>_>.
             super__Head_base<0UL,_supermap::Hasher_*,_false>._M_head_impl;
    iVar5 = (*(pHVar2->super_Cloneable<supermap::Hasher>)._vptr_Cloneable[3])
                      (pHVar2,&local_50,*puVar8);
    p_Var3 = (this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar7 = CONCAT44(extraout_var,iVar5) %
            ((ulong)(this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
            ((long)(this->elements_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var3)
            * 8);
    uVar6 = uVar7 + 0x3f;
    if (-1 < (long)uVar7) {
      uVar6 = uVar7;
    }
    if ((p_Var3[((long)uVar6 >> 6) +
                (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
         (uVar7 & 0x3f) & 1) == 0) break;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool mightContain(const T &value) const override {
        if (elements_.empty()) {
            throw supermap::IllegalStateException("Filter size was not reserved or was set to zero");
        }
        std::string data = serialize(value);
        for (auto &seed : seeds_) {
            std::uint64_t index = getHashWithSeed(data, seed);
            if (!elements_[index]) {
                return false;
            }
        }
        return true;
    }